

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O2

TValue * luaH_setstr(lua_State *L,Table *t,TString *key)

{
  TValue *pTVar1;
  TValue *i_o;
  TValue k;
  Value local_28;
  undefined4 local_20;
  
  pTVar1 = luaH_getstr(t,key);
  if (pTVar1 == &luaO_nilobject_) {
    local_20 = 4;
    local_28 = (Value)key;
    pTVar1 = newkey(L,t,(TValue *)&local_28);
  }
  return pTVar1;
}

Assistant:

TValue *luaH_setstr (lua_State *L, Table *t, TString *key) {
  const TValue *p = luaH_getstr(t, key);
  if (p != luaO_nilobject)
    return cast(TValue *, p);
  else {
    TValue k;
    setsvalue(L, &k, key);
    return newkey(L, t, &k);
  }
}